

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamReaderPrivate::LoadReferenceData(BamReaderPrivate *this)

{
  char acVar1 [4];
  char *data;
  char acVar2 [4];
  BgzfStream *this_00;
  ulong __n;
  bool bVar3;
  allocator local_a1;
  int32_t refLength;
  char buffer [4];
  RaiiBuffer refName;
  RefData aReference;
  string local_50 [32];
  
  this_00 = &this->m_stream;
  BgzfStream::Read(this_00,buffer,4);
  acVar2 = (char  [4])
           ((uint)buffer >> 0x18 | ((uint)buffer & 0xff0000) >> 8 | ((uint)buffer & 0xff00) << 8 |
           (int)buffer << 0x18);
  if (this->m_isBigEndian == false) {
    acVar2 = buffer;
  }
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::reserve
            (&this->m_references,(long)(int)acVar2);
  while (bVar3 = acVar2 != (char  [4])0x0, acVar2 = (char  [4])((int)acVar2 - 1), bVar3) {
    BgzfStream::Read(this_00,buffer,4);
    acVar1 = (char  [4])
             ((uint)buffer >> 0x18 | ((uint)buffer & 0xff0000) >> 8 | ((uint)buffer & 0xff00) << 8 |
             (int)buffer << 0x18);
    if (this->m_isBigEndian == false) {
      acVar1 = buffer;
    }
    __n = (ulong)(uint)acVar1;
    data = (char *)operator_new__(__n);
    memset(data,0,__n);
    refName.Buffer = data;
    refName.NumBytes = __n;
    BgzfStream::Read(this_00,data,__n);
    BgzfStream::Read(this_00,buffer,4);
    refLength._0_1_ = buffer[0];
    refLength._1_1_ = buffer[1];
    refLength._2_1_ = buffer[2];
    refLength._3_1_ = buffer[3];
    if (this->m_isBigEndian == true) {
      SwapEndian_32(&refLength);
    }
    std::__cxx11::string::string(local_50,"",&local_a1);
    std::__cxx11::string::string((string *)&aReference,local_50);
    aReference.RefLength = 0;
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::string(local_50,refName.Buffer,&local_a1);
    std::__cxx11::string::operator=((string *)&aReference,local_50);
    std::__cxx11::string::~string(local_50);
    aReference.RefLength = refLength;
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::push_back
              (&this->m_references,&aReference);
    std::__cxx11::string::~string((string *)&aReference);
    RaiiBuffer::~RaiiBuffer(&refName);
  }
  return true;
}

Assistant:

bool BamReaderPrivate::LoadReferenceData(void) {

    // get number of reference sequences
    char buffer[sizeof(uint32_t)];
    m_stream.Read(buffer, sizeof(uint32_t));
    uint32_t numberRefSeqs = BamTools::UnpackUnsignedInt(buffer);
    if ( m_isBigEndian ) BamTools::SwapEndian_32(numberRefSeqs);
    m_references.reserve((int)numberRefSeqs);

    // iterate over all references in header
    for ( unsigned int i = 0; i != numberRefSeqs; ++i ) {

        // get length of reference name
        m_stream.Read(buffer, sizeof(uint32_t));
        uint32_t refNameLength = BamTools::UnpackUnsignedInt(buffer);
        if ( m_isBigEndian ) BamTools::SwapEndian_32(refNameLength);
        RaiiBuffer refName(refNameLength);

        // get reference name and reference sequence length
        m_stream.Read(refName.Buffer, refNameLength);
        m_stream.Read(buffer, sizeof(int32_t));
        int32_t refLength = BamTools::UnpackSignedInt(buffer);
        if ( m_isBigEndian ) BamTools::SwapEndian_32(refLength);

        // store data for reference
        RefData aReference;
        aReference.RefName   = (string)((const char*)refName.Buffer);
        aReference.RefLength = refLength;
        m_references.push_back(aReference);
    }

    // return success
    return true;
}